

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  short sVar2;
  int iVar3;
  int *piVar4;
  
  if ((pList != (SrcList *)0x0) && (sVar2 = pList->nSrc, 0 < sVar2)) {
    piVar4 = &pList->a[0].iCursor;
    iVar3 = 0;
    do {
      if (-1 < *piVar4) {
        return;
      }
      iVar1 = pParse->nTab;
      pParse->nTab = iVar1 + 1;
      *piVar4 = iVar1;
      if (*(Select **)(piVar4 + -5) != (Select *)0x0) {
        sqlite3SrcListAssignCursors(pParse,(*(Select **)(piVar4 + -5))->pSrc);
        sVar2 = pList->nSrc;
      }
      iVar3 = iVar3 + 1;
      piVar4 = piVar4 + 0x1a;
    } while (iVar3 < sVar2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  assert(pList || pParse->db->mallocFailed );
  if( pList ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) break;
      pItem->iCursor = pParse->nTab++;
      if( pItem->pSelect ){
        sqlite3SrcListAssignCursors(pParse, pItem->pSelect->pSrc);
      }
    }
  }
}